

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iso8601.c
# Opt level: O0

void test_bson_iso8601_utc(void)

{
  test_date_rt("1971-02-03T04:05:06.789Z",0x802837065);
  test_date_io("1971-02-03T04:05:06.78Z","1971-02-03T04:05:06.780Z",0x80283705c);
  test_date_io("1971-02-03T04:05:06.7Z","1971-02-03T04:05:06.700Z",0x80283700c);
  test_date_rt("1971-02-03T04:05:06Z",0x802836d50);
  test_date_io("1971-02-03T04:05Z","1971-02-03T04:05:00Z",0x8028355e0);
  test_date_io("1970-01-01T00:00:00.000Z","1970-01-01T00:00:00Z",0);
  test_date_rt("1970-06-30T01:06:40.981Z",0x39f35bcd5);
  test_date("1970-01-01T00:00:00.000+0100",-3600000);
  test_date_rt("2058-02-20T18:29:11.100Z",0x2879ba87d3c);
  test_date("3001-01-01T08:00:00.000Z",0x1d9733b58000);
  test_date_rt("2013-02-20T18:29:11.100Z",0x13cf8ddcd3c);
  test_date_io("1970-01-01T00:00:00.000Z","1970-01-01T00:00:00Z",0);
  test_date_rt("2012-12-24T12:15:30.500Z",0x13bccd6d8c4);
  test_date("1960-12-24T12:15:30.500Z",-0x424618c33c);
  return;
}

Assistant:

static void
test_bson_iso8601_utc (void)
{
   /* Allowed date format:
    * YYYY-MM-DDTHH:MM[:SS[.m[m[m]]]]Z
    * Year, month, day, hour, and minute are required, while the seconds
    * component and one to
    * three milliseconds are optional.
    */

   test_date_rt ("1971-02-03T04:05:06.789Z", 34401906789ULL);
   test_date_io (
      "1971-02-03T04:05:06.78Z", "1971-02-03T04:05:06.780Z", 34401906780ULL);
   test_date_io (
      "1971-02-03T04:05:06.7Z", "1971-02-03T04:05:06.700Z", 34401906700ULL);
   test_date_rt ("1971-02-03T04:05:06Z", 34401906000ULL);
   test_date_io ("1971-02-03T04:05Z", "1971-02-03T04:05:00Z", 34401900000ULL);
   test_date_io ("1970-01-01T00:00:00.000Z", "1970-01-01T00:00:00Z", 0ULL);
   test_date_rt ("1970-06-30T01:06:40.981Z", 15556000981ULL);
   test_date ("1970-01-01T00:00:00.000+0100", -3600LL * 1000);

   if (!IS_TIME_T_SMALL) {
      test_date_rt ("2058-02-20T18:29:11.100Z", 2781455351100ULL);
      test_date ("3001-01-01T08:00:00.000Z", 32535244800000ULL);
   }

   test_date_rt ("2013-02-20T18:29:11.100Z", 1361384951100ULL);

   /* from the BSON Corpus Tests */
   test_date_io ("1970-01-01T00:00:00.000Z", "1970-01-01T00:00:00Z", 0);
   test_date_rt ("2012-12-24T12:15:30.500Z", 1356351330500);
   test_date ("1960-12-24T12:15:30.500Z", -284643869500LL);
}